

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceVertexVectorQuantity::buildVertexInfoGUI
          (SurfaceVertexVectorQuantity *this,size_t iV)

{
  float fVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  vec<3,_float,_(glm::qualifier)0> vVar4;
  stringstream buffer;
  vec3 local_1c8;
  char *local_1b8 [4];
  stringstream local_198 [16];
  ostream local_188 [376];
  undefined1 auVar3 [56];
  
  auVar3 = in_ZMM0._8_56_;
  ImGui::TextUnformatted(*(char **)&(this->super_SurfaceVectorQuantity).field_0x148,(char *)0x0);
  ImGui::NextColumn();
  vVar4 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getValue
                    (&(this->super_VectorQuantity<polyscope::SurfaceVertexVectorQuantity>).vectors,
                     iV);
  local_1c8.field_2 = vVar4.field_2;
  auVar2._0_8_ = vVar4._0_8_;
  auVar2._8_56_ = auVar3;
  local_1c8._0_8_ = vmovlps_avx(auVar2._0_16_);
  std::__cxx11::stringstream::stringstream(local_198);
  operator<<(local_188,&local_1c8);
  std::__cxx11::stringbuf::str();
  ImGui::TextUnformatted(local_1b8[0],(char *)0x0);
  std::__cxx11::string::~string((string *)local_1b8);
  ImGui::NextColumn();
  ImGui::NextColumn();
  fVar1 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_1c8);
  ImGui::Text("magnitude: %g",(double)fVar1);
  ImGui::NextColumn();
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void SurfaceVertexVectorQuantity::buildVertexInfoGUI(size_t iV) {
  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();

  glm::vec3 vec = vectors.getValue(iV);

  std::stringstream buffer;
  buffer << vec;
  ImGui::TextUnformatted(buffer.str().c_str());

  ImGui::NextColumn();
  ImGui::NextColumn();
  ImGui::Text("magnitude: %g", glm::length(vec));
  ImGui::NextColumn();
}